

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meassure_recv.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  undefined1 auVar1 [16];
  int iVar2;
  code *pcVar3;
  size_t sVar4;
  FILE *pFVar5;
  int i;
  ulong uVar6;
  pthread_t r;
  
  if (argc == 4) {
    __s1 = argv[1];
    iVar2 = strcmp(__s1,"-ff");
    if (iVar2 == 0) {
      method = 1;
      pcVar3 = meassure_ff;
    }
    else {
      iVar2 = strcmp(__s1,"-fr");
      if (iVar2 != 0) goto LAB_001013e1;
      pcVar3 = meassure_fr;
      method = 0;
    }
    meassure = pcVar3;
    frequency = strtoll(argv[2],(char **)0x0,10);
    if (frequency != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = frequency;
      interval = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000000)) / auVar1,0);
      sVar4 = strtoll(argv[3],(char **)0x0,10);
      length = sVar4;
      if (sVar4 != 0) {
        payload = (size_t *)malloc(sVar4 * 8);
        if (payload != (size_t *)0x0) {
          printf("Receiving alternating \'1\' and \'0\'\n- Frequency in Hz: %zu\n- Testdata Length: %lu\n- Method: %s\n"
                 ,frequency,sVar4);
          pthread_create(&r,(pthread_attr_t *)0x0,receiver,(void *)0x0);
          pthread_join(r,(void **)0x0);
          pFVar5 = fopen("groupA.txt","w");
          for (uVar6 = 0; uVar6 < length; uVar6 = uVar6 + 2) {
            fprintf(pFVar5,"%lu\n",payload[uVar6]);
          }
          fclose(pFVar5);
          pFVar5 = fopen("groupB.txt","w");
          for (uVar6 = 1; uVar6 < length; uVar6 = uVar6 + 2) {
            fprintf(pFVar5,"%lu\n",payload[uVar6]);
          }
          fclose(pFVar5);
          return 0;
        }
        fwrite("could not allocate memory\n",0x1a,1,_stderr);
        iVar2 = 2;
        goto LAB_0010141f;
      }
    }
  }
LAB_001013e1:
  fwrite("usage: ./meassure_recv [-ff/-fr] [FREQUENCY] [TESTPOINTS]\n",0x3a,1,_stderr);
  iVar2 = 1;
LAB_0010141f:
  exit(iVar2);
}

Assistant:

int main(int argc, char* argv[])
{
    if(argc == 4)
    {
        if(strcmp(argv[1], "-ff")==0)
        {
            method = FLUSH_FLUSH;
            meassure = meassure_ff;
        }
        else
        {
            if(strcmp(argv[1], "-fr")==0)
            {
                method = FLUSH_RELOAD;
                meassure = meassure_fr;
            }
            else
            {
                goto invalid;
            }
        }

        frequency = strtoll(argv[2], NULL, 10);
        if(frequency==0) goto invalid;
        // interval in nsecs
        interval = 1000000000/frequency;

        length = strtoll(argv[3], NULL, 10);
        if(length==0) goto invalid;
    }
    else
    {
        invalid:
        fprintf(stderr, "usage: ./meassure_recv [-ff/-fr] [FREQUENCY] [TESTPOINTS]\n");
        exit(1);
    }

    payload = malloc(sizeof(size_t)*length);
    if(!payload){fprintf(stderr, "could not allocate memory\n"); exit(2);}


    printf("Receiving alternating \'1\' and \'0\'\n- Frequency in Hz: %zu\n"
           "- Testdata Length: %lu\n"
           "- Method: %s\n",
           frequency, length, method == FLUSH_FLUSH ? "Flush+Flush" : "Flush+Reload");

    pthread_t r;
    pthread_create(&r, NULL, receiver, NULL);
    pthread_join(r, NULL);

    {
        FILE* group_A = fopen("groupA.txt", "w");
        for(int i = 0; i < length; i+=2)
        {
            fprintf(group_A, "%lu\n", payload[i]);
        }

        fclose(group_A);

        FILE* group_B = fopen("groupB.txt", "w");
        for(int i = 1; i < length; i+=2)
        {
            fprintf(group_B, "%lu\n", payload[i]);
        }
        fclose(group_B);
    }

    return 0;
}